

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v5::formatter<void*,char,void>::
parse<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
          (formatter<void_*,_char,_void> *this,
          basic_parse_context<char,_fmt::v5::internal::error_handler> *ctx)

{
  char *pcVar1;
  long in_RDI;
  error_handler eh;
  char type_spec;
  char *it;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  handler;
  type type;
  undefined4 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6c;
  char cVar2;
  undefined1 in_stack_ffffffffffffff6d;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *ctx_00;
  char cVar3;
  dynamic_format_specs<char> *in_stack_ffffffffffffff78;
  dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
  *in_stack_ffffffffffffff80;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  char *in_stack_ffffffffffffffa8;
  basic_parse_context<char,_fmt::v5::internal::error_handler> local_50;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  local_38;
  undefined4 local_14;
  
  local_14 = 0xc;
  ctx_00 = &local_50;
  internal::
  dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>::
  dynamic_specs_handler(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,ctx_00);
  internal::
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  ::specs_checker(&local_38,
                  (dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
                   *)in_stack_ffffffffffffff78,(type)((ulong)ctx_00 >> 0x20));
  basic_parse_context<char,_fmt::v5::internal::error_handler>::begin
            ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)0x24f0ee);
  basic_parse_context<char,_fmt::v5::internal::error_handler>::end
            ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)0x24f100);
  pcVar1 = internal::
           parse_format_specs<char,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&>
                     (in_stack_ffffffffffffffa8,
                      (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
  cVar2 = *(char *)(in_RDI + 0x11);
  basic_parse_context<char,_fmt::v5::internal::error_handler>::error_handler
            ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68
                                                )))));
  cVar3 = (char)((ulong)ctx_00 >> 0x38);
  switch(local_14) {
  case 0:
  case 1:
    break;
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
    internal::error_handler::error_handler
              ((error_handler *)&stack0xffffffffffffffa4,(error_handler *)&stack0xffffffffffffffa6);
    cVar3 = (char)((ulong)ctx_00 >> 0x38);
    internal::int_type_checker<fmt::v5::internal::error_handler>::int_type_checker
              ((int_type_checker<fmt::v5::internal::error_handler> *)&stack0xffffffffffffffa5,
               &stack0xffffffffffffffa4);
    internal::
    handle_int_type_spec<fmt::v5::internal::int_type_checker<fmt::v5::internal::error_handler>>
              (cVar3,(int_type_checker<fmt::v5::internal::error_handler> *)
                     CONCAT17(cVar2,CONCAT16(in_stack_ffffffffffffff6e,
                                             CONCAT15(in_stack_ffffffffffffff6d,
                                                      CONCAT14(in_stack_ffffffffffffff6c,
                                                               in_stack_ffffffffffffff68)))));
    break;
  case 7:
    internal::error_handler::error_handler
              ((error_handler *)&stack0xffffffffffffffa2,(error_handler *)&stack0xffffffffffffffa6);
    internal::char_specs_checker<fmt::v5::internal::error_handler>::char_specs_checker
              ((char_specs_checker<fmt::v5::internal::error_handler> *)&stack0xffffffffffffffa3,
               (int)cVar2,&stack0xffffffffffffffa2);
    internal::
    handle_char_specs<char,fmt::v5::internal::char_specs_checker<fmt::v5::internal::error_handler>>
              ((basic_format_specs<char> *)ctx_00,
               (char_specs_checker<fmt::v5::internal::error_handler> *)
               CONCAT17(in_stack_ffffffffffffff6f,
                        CONCAT16(cVar2,CONCAT15(in_stack_ffffffffffffff6d,
                                                CONCAT14(in_stack_ffffffffffffff6c,
                                                         in_stack_ffffffffffffff68)))));
    break;
  case 8:
  case 9:
    internal::error_handler::error_handler
              ((error_handler *)&stack0xffffffffffffffa0,(error_handler *)&stack0xffffffffffffffa6);
    cVar3 = (char)((ulong)ctx_00 >> 0x38);
    internal::float_type_checker<fmt::v5::internal::error_handler>::float_type_checker
              ((float_type_checker<fmt::v5::internal::error_handler> *)&stack0xffffffffffffffa1,
               &stack0xffffffffffffffa0);
    internal::
    handle_float_type_spec<fmt::v5::internal::float_type_checker<fmt::v5::internal::error_handler>>
              (cVar3,(float_type_checker<fmt::v5::internal::error_handler> *)
                     CONCAT17(in_stack_ffffffffffffff6f,
                              CONCAT16(in_stack_ffffffffffffff6e,
                                       CONCAT15(cVar2,CONCAT14(in_stack_ffffffffffffff6c,
                                                               in_stack_ffffffffffffff68)))));
    break;
  case 10:
    internal::error_handler::error_handler
              ((error_handler *)&stack0xffffffffffffff9e,(error_handler *)&stack0xffffffffffffffa6);
    cVar3 = (char)((ulong)ctx_00 >> 0x38);
    internal::cstring_type_checker<fmt::v5::internal::error_handler>::cstring_type_checker
              ((cstring_type_checker<fmt::v5::internal::error_handler> *)&stack0xffffffffffffff9f,
               &stack0xffffffffffffff9e);
    internal::
    handle_cstring_type_spec<char,fmt::v5::internal::cstring_type_checker<fmt::v5::internal::error_handler>>
              (cVar3,(cstring_type_checker<fmt::v5::internal::error_handler> *)
                     CONCAT17(in_stack_ffffffffffffff6f,
                              CONCAT16(in_stack_ffffffffffffff6e,
                                       CONCAT15(in_stack_ffffffffffffff6d,
                                                CONCAT14(cVar2,in_stack_ffffffffffffff68)))));
    break;
  case 0xb:
    internal::check_string_type_spec<char,fmt::v5::internal::error_handler&>
              (cVar3,(error_handler *)
                     CONCAT17(in_stack_ffffffffffffff6f,
                              CONCAT16(in_stack_ffffffffffffff6e,
                                       CONCAT15(in_stack_ffffffffffffff6d,
                                                CONCAT14(in_stack_ffffffffffffff6c,
                                                         in_stack_ffffffffffffff68)))));
    break;
  case 0xc:
    internal::check_pointer_type_spec<char,fmt::v5::internal::error_handler&>
              (cVar3,(error_handler *)
                     CONCAT17(in_stack_ffffffffffffff6f,
                              CONCAT16(in_stack_ffffffffffffff6e,
                                       CONCAT15(in_stack_ffffffffffffff6d,
                                                CONCAT14(in_stack_ffffffffffffff6c,
                                                         in_stack_ffffffffffffff68)))));
    break;
  case 0xd:
  }
  return pcVar1;
}

Assistant:

FMT_CONSTEXPR typename ParseContext::iterator parse(ParseContext &ctx) {
    typedef internal::dynamic_specs_handler<ParseContext> handler_type;
    auto type = internal::get_type<
      typename buffer_context<Char>::type, T>::value;
    internal::specs_checker<handler_type>
        handler(handler_type(specs_, ctx), type);
    auto it = parse_format_specs(ctx.begin(), ctx.end(), handler);
    auto type_spec = specs_.type;
    auto eh = ctx.error_handler();
    switch (type) {
    case internal::none_type:
    case internal::named_arg_type:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case internal::int_type:
    case internal::uint_type:
    case internal::long_long_type:
    case internal::ulong_long_type:
    case internal::bool_type:
      handle_int_type_spec(
            type_spec, internal::int_type_checker<decltype(eh)>(eh));
      break;
    case internal::char_type:
      handle_char_specs(
          &specs_,
          internal::char_specs_checker<decltype(eh)>(type_spec, eh));
      break;
    case internal::double_type:
    case internal::long_double_type:
      handle_float_type_spec(
            type_spec, internal::float_type_checker<decltype(eh)>(eh));
      break;
    case internal::cstring_type:
      internal::handle_cstring_type_spec(
            type_spec, internal::cstring_type_checker<decltype(eh)>(eh));
      break;
    case internal::string_type:
      internal::check_string_type_spec(type_spec, eh);
      break;
    case internal::pointer_type:
      internal::check_pointer_type_spec(type_spec, eh);
      break;
    case internal::custom_type:
      // Custom format specifiers should be checked in parse functions of
      // formatter specializations.
      break;
    }
    return it;
  }